

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O2

void __thiscall
cmComputeTargetDepends::CollectTargetDepends(cmComputeTargetDepends *this,int depender_index)

{
  cmGeneratorTarget *this_00;
  pointer pcVar1;
  cmake *this_01;
  pointer pbVar2;
  pointer ppcVar3;
  TargetType TVar4;
  cmLinkImplementation *pcVar5;
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *psVar6;
  _Base_ptr p_Var7;
  pointer config;
  pointer ppcVar8;
  cmLinkImplItem *lib;
  pointer __v;
  pair<std::_Rb_tree_iterator<cmLinkItem>,_bool> pVar9;
  allocator<char> local_179;
  cmComputeTargetDepends *local_178;
  string *local_170;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectFiles;
  cmListFileBacktrace local_128;
  string local_118;
  undefined1 local_f8 [16];
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> emitted;
  cmListFileBacktrace local_b8;
  cmLinkItem local_a8;
  string local_70;
  string local_50;
  
  this_00 = (this->Targets).
            super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
            ._M_impl.super__Vector_impl_data._M_start[depender_index];
  local_178 = this;
  TVar4 = cmGeneratorTarget::GetType(this_00);
  if (TVar4 != INTERFACE_LIBRARY) {
    emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &emitted._M_t._M_impl.super__Rb_tree_header._M_header;
    emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    emitted._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    configs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    configs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    configs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    cmMakefile::GetConfigurations(&local_50,this_00->Makefile,&configs,true);
    std::__cxx11::string::~string((string *)&local_50);
    if (configs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        configs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>(&configs);
    }
    pbVar2 = configs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    config = configs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    while (config != pbVar2) {
      objectFiles.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      objectFiles.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      objectFiles.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_170 = config;
      cmGeneratorTarget::GetExternalObjects(this_00,&objectFiles,config);
      ppcVar3 = objectFiles.
                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppcVar8 = objectFiles.
                     super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppcVar8 != ppcVar3;
          ppcVar8 = ppcVar8 + 1) {
        cmSourceFile::GetObjectLibrary_abi_cxx11_(&local_70,*ppcVar8);
        if (local_70._M_string_length != 0) {
          local_118._M_dataplus._M_p = (pointer)0x0;
          local_118._M_string_length = 0;
          cmGeneratorTarget::ResolveLinkItem
                    (&local_a8,this_00,&local_70,(cmListFileBacktrace *)&local_118);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_118._M_string_length);
          pVar9 = std::
                  _Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
                  ::_M_insert_unique<cmLinkItem_const&>
                            ((_Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
                              *)&emitted,&local_a8);
          if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            TVar4 = cmGeneratorTarget::GetType(this_00);
            if (TVar4 != EXECUTABLE) {
              TVar4 = cmGeneratorTarget::GetType(this_00);
              if (TVar4 != STATIC_LIBRARY) {
                TVar4 = cmGeneratorTarget::GetType(this_00);
                if (TVar4 != SHARED_LIBRARY) {
                  TVar4 = cmGeneratorTarget::GetType(this_00);
                  if (TVar4 != MODULE_LIBRARY) {
                    TVar4 = cmGeneratorTarget::GetType(this_00);
                    if (TVar4 != OBJECT_LIBRARY) {
                      this_01 = local_178->GlobalGenerator->CMakeInstance;
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_118,
                                 "Only executables and libraries may reference target objects.",
                                 &local_179);
                      cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_f8);
                      cmake::IssueMessage(this_01,FATAL_ERROR,&local_118,
                                          (cmListFileBacktrace *)local_f8);
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f8 + 8));
                      std::__cxx11::string::~string((string *)&local_118);
                      cmLinkItem::~cmLinkItem(&local_a8);
                      std::__cxx11::string::~string((string *)&local_70);
                      std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                      ::~_Vector_base(&objectFiles.
                                       super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                     );
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~vector(&configs);
                      goto LAB_00264650;
                    }
                  }
                }
              }
            }
            cmTarget::AddUtility(this_00->Target,&local_70,(cmMakefile *)0x0);
          }
          cmLinkItem::~cmLinkItem(&local_a8);
        }
        std::__cxx11::string::~string((string *)&local_70);
      }
      pcVar5 = cmGeneratorTarget::GetLinkImplementation(this_00,local_170);
      local_128.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_128.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      cmLinkItem::cmLinkItem(&local_a8,this_00,&local_128);
      std::
      _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
      ::_M_insert_unique<cmLinkItem>
                ((_Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
                  *)&emitted,&local_a8);
      cmLinkItem::~cmLinkItem(&local_a8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_128.TopEntry.
                  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      pcVar1 = (pcVar5->super_cmLinkImplementationLibraries).Libraries.
               super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (__v = (pcVar5->super_cmLinkImplementationLibraries).Libraries.
                 super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                 super__Vector_impl_data._M_start; __v != pcVar1; __v = __v + 1) {
        pVar9 = std::
                _Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
                ::_M_insert_unique<cmLinkItem_const&>
                          ((_Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
                            *)&emitted,&__v->super_cmLinkItem);
        if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          AddTargetDepend(local_178,depender_index,&__v->super_cmLinkItem,true);
          AddInterfaceDepends(local_178,depender_index,&__v->super_cmLinkItem,local_170,&emitted);
        }
      }
      std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
                (&objectFiles.
                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>);
      config = local_170 + 1;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&configs);
    std::
    _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
    ::~_Rb_tree(&emitted._M_t);
    psVar6 = cmGeneratorTarget::GetUtilityItems(this_00);
    emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &emitted._M_t._M_impl.super__Rb_tree_header._M_header;
    emitted._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_b8.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_b8.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    cmLinkItem::cmLinkItem(&local_a8,this_00,&local_b8);
    std::
    _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
    ::_M_insert_unique<cmLinkItem>(&emitted._M_t,&local_a8);
    cmLinkItem::~cmLinkItem(&local_a8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_b8.TopEntry.
                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    for (p_Var7 = (psVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var7 != &(psVar6->_M_t)._M_impl.super__Rb_tree_header;
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
      pVar9 = std::
              _Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
              ::_M_insert_unique<cmLinkItem_const&>
                        ((_Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
                          *)&emitted,(cmLinkItem *)(p_Var7 + 1));
      if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        AddTargetDepend(local_178,depender_index,(cmLinkItem *)(p_Var7 + 1),false);
      }
    }
LAB_00264650:
    std::
    _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
    ::~_Rb_tree(&emitted._M_t);
  }
  return;
}

Assistant:

void cmComputeTargetDepends::CollectTargetDepends(int depender_index)
{
  // Get the depender.
  cmGeneratorTarget const* depender = this->Targets[depender_index];
  if (depender->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    return;
  }

  // Loop over all targets linked directly in all configs.
  // We need to make targets depend on the union of all config-specific
  // dependencies in all targets, because the generated build-systems can't
  // deal with config-specific dependencies.
  {
    std::set<cmLinkItem> emitted;

    std::vector<std::string> configs;
    depender->Makefile->GetConfigurations(configs);
    if (configs.empty()) {
      configs.emplace_back();
    }
    for (std::string const& it : configs) {
      std::vector<cmSourceFile const*> objectFiles;
      depender->GetExternalObjects(objectFiles, it);
      for (cmSourceFile const* o : objectFiles) {
        std::string const& objLib = o->GetObjectLibrary();
        if (!objLib.empty()) {
          cmLinkItem const& objItem =
            depender->ResolveLinkItem(objLib, cmListFileBacktrace());
          if (emitted.insert(objItem).second) {
            if (depender->GetType() != cmStateEnums::EXECUTABLE &&
                depender->GetType() != cmStateEnums::STATIC_LIBRARY &&
                depender->GetType() != cmStateEnums::SHARED_LIBRARY &&
                depender->GetType() != cmStateEnums::MODULE_LIBRARY &&
                depender->GetType() != cmStateEnums::OBJECT_LIBRARY) {
              this->GlobalGenerator->GetCMakeInstance()->IssueMessage(
                MessageType::FATAL_ERROR,
                "Only executables and libraries may reference target objects.",
                depender->GetBacktrace());
              return;
            }
            const_cast<cmGeneratorTarget*>(depender)->Target->AddUtility(
              objLib);
          }
        }
      }

      cmLinkImplementation const* impl = depender->GetLinkImplementation(it);

      // A target should not depend on itself.
      emitted.insert(cmLinkItem(depender, cmListFileBacktrace()));
      for (cmLinkImplItem const& lib : impl->Libraries) {
        // Don't emit the same library twice for this target.
        if (emitted.insert(lib).second) {
          this->AddTargetDepend(depender_index, lib, true);
          this->AddInterfaceDepends(depender_index, lib, it, emitted);
        }
      }
    }
  }

  // Loop over all utility dependencies.
  {
    std::set<cmLinkItem> const& tutils = depender->GetUtilityItems();
    std::set<cmLinkItem> emitted;
    // A target should not depend on itself.
    emitted.insert(cmLinkItem(depender, cmListFileBacktrace()));
    for (cmLinkItem const& litem : tutils) {
      // Don't emit the same utility twice for this target.
      if (emitted.insert(litem).second) {
        this->AddTargetDepend(depender_index, litem, false);
      }
    }
  }
}